

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ReduceSumSquareLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducesumsquare(NeuralNetworkLayer *this)

{
  ReduceSumSquareLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x50a) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x50a;
    this_00 = (ReduceSumSquareLayerParams *)operator_new(0x30);
    ReduceSumSquareLayerParams::ReduceSumSquareLayerParams(this_00);
    (this->layer_).reducesumsquare_ = this_00;
  }
  return (ReduceSumSquareLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceSumSquareLayerParams* NeuralNetworkLayer::mutable_reducesumsquare() {
  if (!has_reducesumsquare()) {
    clear_layer();
    set_has_reducesumsquare();
    layer_.reducesumsquare_ = new ::CoreML::Specification::ReduceSumSquareLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceSumSquare)
  return layer_.reducesumsquare_;
}